

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O0

BIGNUM * BN_lebin2bn(uchar *s,int len,BIGNUM *ret)

{
  BIGNUM *pBVar1;
  int iVar2;
  BIGNUM *in_RDX;
  int in_ESI;
  long in_RDI;
  bool bVar3;
  BIGNUM *bn;
  unsigned_long l;
  uint n;
  uint m;
  uint i;
  uint in_stack_ffffffffffffffbc;
  uint words;
  BIGNUM *a;
  ulong local_38;
  int local_2c;
  uint local_28;
  uint local_24;
  BIGNUM *local_20;
  int local_14;
  byte *local_10;
  BIGNUM *local_8;
  
  a = (BIGNUM *)0x0;
  local_20 = in_RDX;
  if (in_RDX == (BIGNUM *)0x0) {
    a = BN_new();
    local_20 = (BIGNUM *)a;
  }
  if (local_20 == (BIGNUM *)0x0) {
    local_8 = (BIGNUM *)0x0;
  }
  else {
    local_10 = (byte *)(in_RDI + in_ESI);
    local_14 = in_ESI;
    while( true ) {
      words = in_stack_ffffffffffffffbc & 0xffffff;
      if (0 < local_14) {
        words = CONCAT13(local_10[-1] == 0,(int3)in_stack_ffffffffffffffbc);
      }
      if ((char)(words >> 0x18) == '\0') break;
      local_10 = local_10 + -1;
      local_14 = local_14 + -1;
      in_stack_ffffffffffffffbc = words;
    }
    local_2c = local_14;
    if (local_14 == 0) {
      local_20->top = 0;
      local_8 = local_20;
    }
    else {
      local_24 = (local_14 - 1U >> 3) + 1;
      pBVar1 = bn_wexpand((BIGNUM *)a,words);
      if (pBVar1 == (BIGNUM *)0x0) {
        BN_free(a);
        local_8 = (BIGNUM *)0x0;
      }
      else {
        local_20->top = local_24;
        local_20->neg = 0;
        local_38 = 0;
        local_28 = local_14 - 1U & 7;
        while (iVar2 = local_2c + -1, local_2c != 0) {
          local_10 = local_10 + -1;
          local_38 = local_38 << 8 | (ulong)*local_10;
          bVar3 = local_28 == 0;
          local_2c = iVar2;
          local_28 = local_28 - 1;
          if (bVar3) {
            local_24 = local_24 - 1;
            local_20->d[local_24] = local_38;
            local_38 = 0;
            local_28 = 7;
          }
        }
        bn_correct_top(local_20);
        local_8 = local_20;
      }
    }
  }
  return local_8;
}

Assistant:

BIGNUM *BN_lebin2bn(const unsigned char *s, int len, BIGNUM *ret)
{
    unsigned int i, m;
    unsigned int n;
    BN_ULONG l;
    BIGNUM *bn = NULL;

    if (ret == NULL)
        ret = bn = BN_new();
    if (ret == NULL)
        return (NULL);
    bn_check_top(ret);
    s += len;
    /* Skip trailing zeroes. */
    for ( ; len > 0 && s[-1] == 0; s--, len--)
        continue;
    n = len;
    if (n == 0) {
        ret->top = 0;
        return ret;
    }
    i = ((n - 1) / BN_BYTES) + 1;
    m = ((n - 1) % (BN_BYTES));
    if (bn_wexpand(ret, (int)i) == NULL) {
        BN_free(bn);
        return NULL;
    }
    ret->top = i;
    ret->neg = 0;
    l = 0;
    while (n--) {
        s--;
        l = (l << 8L) | *s;
        if (m-- == 0) {
            ret->d[--i] = l;
            l = 0;
            m = BN_BYTES - 1;
        }
    }
    /*
     * need to call this due to clear byte at top if avoiding having the top
     * bit set (-ve number)
     */
    bn_correct_top(ret);
    return ret;
}